

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O1

bool TextKeyTest<unsigned_int>
               (hashfunc<unsigned_int> hash,char *prefix,char *coreset,int corelen,char *suffix,
               bool drawDiagram)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  void *__dest;
  ulong uVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  double dVar13;
  vector<unsigned_int,_std::allocator<unsigned_int>_> hashes;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  sVar5 = strlen(prefix);
  sVar6 = strlen(suffix);
  sVar7 = strlen(coreset);
  iVar3 = (int)sVar5;
  iVar4 = iVar3 + corelen + (int)sVar6;
  iVar10 = (int)sVar7;
  dVar13 = pow((double)iVar10,(double)corelen);
  uVar12 = (uint)dVar13;
  printf("Keyset \'Text\' - keys of form \"%s[",prefix);
  iVar9 = corelen;
  if (0 < corelen) {
    do {
      putchar(0x58);
      iVar9 = iVar9 + -1;
    } while (iVar9 != 0);
  }
  printf("]%s\" - %d keys\n",suffix,(ulong)uVar12);
  iVar9 = -1;
  if (-2 < iVar4) {
    iVar9 = iVar4 + 1;
  }
  __dest = operator_new__((long)iVar9);
  *(undefined1 *)((long)__dest + (long)iVar4) = 0;
  memcpy(__dest,prefix,(long)iVar3);
  memcpy((void *)((long)corelen + (long)iVar3 + (long)__dest),suffix,(long)(int)sVar6);
  local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&local_48,(long)(int)uVar12);
  if (0 < (int)uVar12) {
    uVar11 = 0;
    do {
      if (0 < corelen) {
        uVar8 = 0;
        uVar1 = uVar11;
        do {
          iVar9 = (int)uVar1;
          uVar1 = (long)iVar9 / (long)iVar10;
          *(char *)((long)__dest + uVar8 + (long)iVar3) = coreset[iVar9 % iVar10];
          uVar8 = uVar8 + 1;
        } while ((uint)corelen != uVar8);
      }
      (*hash.m_hash)(__dest,iVar4,0,
                     local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start + uVar11);
      uVar11 = uVar11 + 1;
    } while (uVar11 != uVar12);
  }
  bVar2 = TestHashList<unsigned_int>(&local_48,drawDiagram,true,true,true,true);
  putchar(10);
  operator_delete__(__dest);
  if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  return bVar2;
}

Assistant:

bool TextKeyTest ( hashfunc<hashtype> hash, const char * prefix, const char * coreset, const int corelen, const char * suffix, bool drawDiagram )
{
  const int prefixlen = (int)strlen(prefix);
  const int suffixlen = (int)strlen(suffix);
  const int corecount = (int)strlen(coreset);

  const int keybytes = prefixlen + corelen + suffixlen;
  const int keycount = (int)pow(double(corecount),double(corelen));

  printf("Keyset 'Text' - keys of form \"%s[",prefix);
  for(int i = 0; i < corelen; i++) printf("X");
  printf("]%s\" - %d keys\n",suffix,keycount);

  uint8_t * key = new uint8_t[keybytes+1];

  key[keybytes] = 0;

  memcpy(key,prefix,prefixlen);
  memcpy(key+prefixlen+corelen,suffix,suffixlen);

  //----------

  std::vector<hashtype> hashes;
  hashes.resize(keycount);

  for(int i = 0; i < keycount; i++)
  {
    int t = i;

    for(int j = 0; j < corelen; j++)
    {
      key[prefixlen+j] = coreset[t % corecount]; t /= corecount;
    }

    hash(key,keybytes,0,&hashes[i]);
  }

  //----------

  bool result = true;

  result &= TestHashList(hashes,drawDiagram);

  printf("\n");

  delete [] key;

  return result;
}